

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRMatrixUtil.cpp
# Opt level: O2

int ZXing::QRCode::CalculateBCHCode(int value,int poly)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0x20;
  if (poly != 0) {
    uVar2 = 0x1f;
    if (poly != 0) {
      for (; (uint)poly >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  uVar1 = value << (~(byte)uVar2 & 0x1f);
  while( true ) {
    uVar3 = 0x20;
    if (uVar1 != 0) {
      uVar3 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    if (uVar2 < uVar3) break;
    uVar1 = uVar1 ^ poly << ((byte)uVar2 - (char)uVar3 & 0x1f);
  }
  return uVar1;
}

Assistant:

static int CalculateBCHCode(int value, int poly)
{
	// If poly is "1 1111 0010 0101" (version info poly), msbSetInPoly is 13. We'll subtract 1
	// from 13 to make it 12.
	int msbSetInPoly = FindMSBSet(poly);
	value <<= msbSetInPoly - 1;
	// Do the division business using exclusive-or operations.
	while (FindMSBSet(value) >= msbSetInPoly) {
		value ^= poly << (FindMSBSet(value) - msbSetInPoly);
	}
	// Now the "value" is the remainder (i.e. the BCH code)
	return value;
}